

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int getencoding(xmlattr_list *list)

{
  xmlattr *pxVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  for (pxVar1 = list->first; pxVar1 != (xmlattr *)0x0; pxVar1 = pxVar1->next) {
    iVar2 = strcmp(pxVar1->name,"style");
    if (iVar2 == 0) {
      __s1 = pxVar1->value;
      iVar2 = strcmp(__s1,"application/octet-stream");
      if (iVar2 == 0) {
        iVar3 = 0;
      }
      else {
        iVar2 = strcmp(__s1,"application/x-gzip");
        if (iVar2 == 0) {
          iVar3 = 1;
        }
        else {
          iVar2 = strcmp(__s1,"application/x-bzip2");
          if (iVar2 == 0) {
            iVar3 = 2;
          }
          else {
            iVar2 = strcmp(__s1,"application/x-lzma");
            if (iVar2 == 0) {
              iVar3 = 3;
            }
            else {
              iVar2 = strcmp(__s1,"application/x-xz");
              if (iVar2 == 0) {
                iVar3 = 4;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
getencoding(struct xmlattr_list *list)
{
	struct xmlattr *attr;
	enum enctype encoding = NONE;

	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "style") == 0) {
			if (strcmp(attr->value, "application/octet-stream") == 0)
				encoding = NONE;
			else if (strcmp(attr->value, "application/x-gzip") == 0)
				encoding = GZIP;
			else if (strcmp(attr->value, "application/x-bzip2") == 0)
				encoding = BZIP2;
			else if (strcmp(attr->value, "application/x-lzma") == 0)
				encoding = LZMA;
			else if (strcmp(attr->value, "application/x-xz") == 0)
				encoding = XZ;
		}
	}
	return (encoding);
}